

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

string * __thiscall
PacketProcessor::Encode(string *__return_storage_ptr__,PacketProcessor *this,string *rawstr)

{
  char *pcVar1;
  pointer pcVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  string str;
  string local_38;
  
  pcVar2 = (rawstr->_M_dataplus)._M_p;
  if ((this->emulti_e == '\0') || ((pcVar2[2] == -1 && (pcVar2[3] == -1)))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + rawstr->_M_string_length);
  }
  else {
    DickWinder(&local_38,rawstr,this->emulti_e);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::resize
              ((ulong)__return_storage_ptr__,(char)(uint)local_38._M_string_length);
    *(__return_storage_ptr__->_M_dataplus)._M_p = *local_38._M_dataplus._M_p;
    (__return_storage_ptr__->_M_dataplus)._M_p[1] = local_38._M_dataplus._M_p[1];
    uVar4 = 2;
    if (2 < (int)(uint)local_38._M_string_length) {
      uVar3 = (uint)local_38._M_string_length - 3 >> 1;
      lVar8 = 0;
      do {
        (__return_storage_ptr__->_M_dataplus)._M_p[lVar8 * 2 + 2] =
             local_38._M_dataplus._M_p[lVar8 + 2] + -0x80;
        lVar8 = lVar8 + 1;
      } while ((ulong)uVar3 + 1 != lVar8);
      uVar4 = (ulong)(uVar3 + 3);
    }
    uVar3 = ~((uint)local_38._M_string_length & 1) + (uint)local_38._M_string_length;
    if (1 < (int)uVar3) {
      uVar5 = (ulong)uVar3;
      iVar7 = ((uint)local_38._M_string_length - ((uint)local_38._M_string_length & 1)) + 1;
      do {
        pcVar1 = local_38._M_dataplus._M_p + uVar4;
        uVar4 = uVar4 + 1;
        (__return_storage_ptr__->_M_dataplus)._M_p[uVar5] = *pcVar1 + -0x80;
        uVar5 = uVar5 - 2;
        iVar7 = iVar7 + -2;
      } while (3 < iVar7);
    }
    if (2 < (int)(uint)local_38._M_string_length) {
      uVar4 = 2;
      do {
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        cVar6 = pcVar2[uVar4];
        if (cVar6 == -0x80) {
          cVar6 = '\0';
LAB_0017f824:
          pcVar2[uVar4] = cVar6;
        }
        else if (cVar6 == '\0') {
          cVar6 = -0x80;
          goto LAB_0017f824;
        }
        uVar4 = uVar4 + 1;
      } while (((uint)local_38._M_string_length & 0x7fffffff) != uVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PacketProcessor::Encode(const std::string &rawstr)
{
	if (emulti_e == 0 || ((unsigned char)rawstr[2] == PACKET_A_INIT && (unsigned char)rawstr[3] == PACKET_F_INIT))
		return rawstr;

	std::string str = this->DickWinderE(rawstr);
	std::string newstr;
	int length = str.length();
	int i = 2;
	int ii = 2;

	newstr.resize(length);

	newstr[0] = str[0];
	newstr[1] = str[1];

	while (i < length)
	{
		newstr[i] = (unsigned char)str[ii++] ^ 0x80;
		i += 2;
	}

	i = length - 1;

	if (length % 2)
	{
		--i;
	}

	while (i >= 2)
	{
		newstr[i] = (unsigned char)str[ii++] ^ 0x80;
		i -= 2;
	}

	for (int i = 2; i < length; ++i)
	{
		if (static_cast<unsigned char>(newstr[i]) == 128)
		{
			newstr[i] = 0;
		}
		else if (newstr[i] == 0)
		{
			newstr[i] = 128;
		}
	}

	return newstr;
}